

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O1

void __thiscall
wabt::BindingHash::CreateDuplicatesVector(BindingHash *this,ValueTypeVector *out_duplicates)

{
  bool bVar1;
  int iVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *local_40;
  vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
  *local_38;
  
  p_Var4 = (this->
           super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
           )._M_h._M_before_begin._M_nxt;
  p_Var5 = p_Var4->_M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    bVar1 = true;
    local_38 = (vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
                *)out_duplicates;
    do {
      p_Var3 = p_Var4[2]._M_nxt;
      if (p_Var3 == p_Var5[2]._M_nxt) {
        if (p_Var3 == (_Hash_node_base *)0x0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp((_Hash_node_base *)
                       (((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                          *)(p_Var4 + 1))->first)._M_dataplus._M_p,
                       (_Hash_node_base *)
                       (((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                          *)(p_Var5 + 1))->first)._M_dataplus._M_p,(size_t)p_Var3);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      p_Var3 = p_Var5;
      if (bVar6) {
        if (bVar1) {
          local_40 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                      *)(p_Var4 + 1);
          std::
          vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
          ::emplace_back<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                    (local_38,&local_40);
        }
        local_40 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                    *)(p_Var5 + 1);
        std::
        vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
        ::emplace_back<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                  (local_38,&local_40);
        p_Var3 = p_Var4;
      }
      bVar1 = (bool)(bVar6 ^ 1);
      p_Var5 = p_Var5->_M_nxt;
      p_Var4 = p_Var3;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void BindingHash::CreateDuplicatesVector(
    ValueTypeVector* out_duplicates) const {
  // This relies on the fact that in an unordered_multimap, all values with the
  // same key are adjacent in iteration order.
  auto first = begin();
  bool is_first = true;
  for (auto iter = std::next(first); iter != end(); ++iter) {
    if (first->first == iter->first) {
      if (is_first) {
        out_duplicates->push_back(&*first);
      }
      out_duplicates->push_back(&*iter);
      is_first = false;
    } else {
      is_first = true;
      first = iter;
    }
  }
}